

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

int Vec_IntTwoRemove(Vec_Int_t *vArr1,Vec_Int_t *vArr2)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int extraout_EAX;
  int *piVar5;
  int *piVar6;
  ulong uVar7;
  int *piVar8;
  long lVar9;
  
  piVar4 = vArr1->pArray;
  piVar8 = vArr2->pArray;
  iVar2 = vArr1->nSize;
  piVar1 = piVar8 + vArr2->nSize;
  piVar5 = piVar4;
  piVar6 = piVar4;
  do {
    uVar7 = (long)piVar6 - (long)piVar4;
    while( true ) {
      if ((piVar4 + iVar2 <= piVar5) || (piVar1 <= piVar8)) {
        for (lVar9 = 0; (int *)((long)piVar5 + lVar9) < piVar4 + iVar2; lVar9 = lVar9 + 4) {
          *(int *)((long)piVar6 + lVar9) = *(int *)((long)piVar5 + lVar9);
          uVar7 = uVar7 + 4;
        }
        Vec_IntShrink(vArr1,(int)(uVar7 >> 2));
        return extraout_EAX;
      }
      iVar3 = *piVar5;
      if (iVar3 == *piVar8) break;
      if (*piVar8 <= iVar3) goto LAB_003c4920;
      piVar5 = piVar5 + 1;
      *piVar6 = iVar3;
      piVar6 = piVar6 + 1;
      uVar7 = uVar7 + 4;
    }
    piVar5 = piVar5 + 1;
LAB_003c4920:
    piVar8 = piVar8 + 1;
  } while( true );
}

Assistant:

static inline int Vec_IntTwoRemove( Vec_Int_t * vArr1, Vec_Int_t * vArr2 )
{
    int * pBeg1 = vArr1->pArray;
    int * pBeg2 = vArr2->pArray;
    int * pEnd1 = vArr1->pArray + vArr1->nSize;
    int * pEnd2 = vArr2->pArray + vArr2->nSize;
    int * pBeg1New = vArr1->pArray;
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            pBeg1++, pBeg2++;
        else if ( *pBeg1 < *pBeg2 )
            *pBeg1New++ = *pBeg1++;
        else 
            pBeg2++;
    }
    while ( pBeg1 < pEnd1 )
        *pBeg1New++ = *pBeg1++;
    Vec_IntShrink( vArr1, pBeg1New - vArr1->pArray );
    return Vec_IntSize(vArr1);
}